

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UI.cpp
# Opt level: O1

void __thiscall UI::setNodeProperties(UI *this,Vertex<std::pair<double,_double>_> *node,int id)

{
  GraphViewer *pGVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  switch(node->tag) {
  case quinta:
    GraphViewer::setVertexSize(this->gv,id,10);
    pGVar1 = this->gv;
    paVar3 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BLUE","");
    GraphViewer::setVertexColor(pGVar1,id,&local_40);
    _Var2._M_p = local_40._M_dataplus._M_p;
    break;
  case garagem:
    GraphViewer::setVertexSize(this->gv,id,10);
    pGVar1 = this->gv;
    paVar3 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ORANGE","");
    GraphViewer::setVertexColor(pGVar1,id,&local_60);
    _Var2._M_p = local_60._M_dataplus._M_p;
    break;
  case cliente:
    GraphViewer::setVertexSize(this->gv,id,10);
    pGVar1 = this->gv;
    paVar3 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"RED","");
    GraphViewer::setVertexColor(pGVar1,id,&local_80);
    _Var2._M_p = local_80._M_dataplus._M_p;
    break;
  case none:
    GraphViewer::setVertexSize(this->gv,id,3);
    pGVar1 = this->gv;
    paVar3 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"YELLOW","");
    GraphViewer::setVertexColor(pGVar1,id,&local_a0);
    _Var2._M_p = local_a0._M_dataplus._M_p;
    break;
  default:
    goto switchD_00113fa5_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
  }
switchD_00113fa5_default:
  return;
}

Assistant:

void UI::setNodeProperties(Vertex<coordinates> *node, int id) {
    switch (node->tag) {
        case quinta:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "BLUE");
            break;
        case garagem:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "ORANGE");
            break;
        case cliente:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "RED");
            break;
        case none:
            gv->setVertexSize(id, 3);
            gv->setVertexColor(id, "YELLOW");
            break;
    }
}